

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O1

IterateResult __thiscall
glcts::GeometryShaderGetProgramivTest::iterate(GeometryShaderGetProgramivTest *this)

{
  ostringstream *this_00;
  int iVar1;
  GLuint GVar2;
  deUint32 err;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  char *description;
  long lVar4;
  bool bVar5;
  GLint rv;
  GLenum pnames [4];
  undefined4 local_1cc;
  GLenum local_1c8 [6];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar3;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if ((this->super_TestCaseBase).m_is_geometry_shader_extension_supported != false) {
    GVar2 = (**(code **)(lVar3 + 0x3c8))();
    this->m_po_id = GVar2;
    err = (**(code **)(lVar3 + 0x800))();
    glu::checkError(err,"glCreateProgram() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
                    ,0x218);
    local_1c8[0] = (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_LINKED_VERTICES_OUT;
    local_1c8[1] = (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_LINKED_INPUT_TYPE;
    local_1c8[2] = (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_LINKED_OUTPUT_TYPE;
    local_1c8[3] = (this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER_INVOCATIONS;
    this_00 = (ostringstream *)(local_1b0 + 8);
    bVar5 = true;
    lVar4 = 0;
    do {
      local_1cc = 0xffffffff;
      (**(code **)(lVar3 + 0x9d8))(this->m_po_id,local_1c8[lVar4],&local_1cc);
      iVar1 = (**(code **)(lVar3 + 0x800))();
      if (iVar1 != 0x502) {
        local_1b0._0_8_ =
             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"No error generated by glGetProgramiv() for pname [",0x32);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
        bVar5 = false;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    if (!bVar5) {
      description = "Fail";
    }
    else {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar5,
               description);
    return STOP;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Geometry shader functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderAPI.cpp"
             ,0x212);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderGetProgramivTest::iterate()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* This test should only run if EXT_geometry_shader is supported. */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Create a program object */
	m_po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() call failed.");

	/* Verify that GS-specific queries cause a GL_INVALID_OPERATION error */
	const glw::GLenum pnames[] = { m_glExtTokens.GEOMETRY_LINKED_VERTICES_OUT, m_glExtTokens.GEOMETRY_LINKED_INPUT_TYPE,
								   m_glExtTokens.GEOMETRY_LINKED_OUTPUT_TYPE,
								   m_glExtTokens.GEOMETRY_SHADER_INVOCATIONS };
	const unsigned int n_pnames = sizeof(pnames) / sizeof(pnames[0]);

	for (unsigned int n_pname = 0; n_pname < n_pnames; ++n_pname)
	{
		glw::GLenum error_code = GL_NO_ERROR;
		glw::GLenum pname	  = pnames[n_pname];
		glw::GLint  rv		   = -1;

		gl.getProgramiv(m_po_id, pname, &rv);

		error_code = gl.getError();

		if (error_code != GL_INVALID_OPERATION)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "No error generated by glGetProgramiv() for pname [" << pname
							   << "]" << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all pnames) */

	if (result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	return STOP;
}